

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O1

void opengv::generateRandom3D3DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *points1,bearingVectors_t *points2,MatrixXd *gt)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double dVar4;
  double *pdVar5;
  ulong uVar6;
  iterator iVar7;
  pointer pMVar8;
  pointer pMVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  rotation_t *prVar16;
  long lVar17;
  long lVar18;
  PointerType ptr;
  ulong uVar19;
  ActualDstType actualDst;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  translation_t *ptVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar31 [16];
  point_t p;
  Matrix<double,_3,_1,_0,_3,_1> local_100;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [16];
  double local_d0;
  rotation_t *local_c8;
  variable_if_dynamic<long,__1> local_c0 [2];
  double local_b0;
  translation_t *local_a8;
  translation_t *local_90;
  undefined1 local_88 [8];
  double *pdStack_80;
  double local_78;
  rotation_t *local_70;
  double *local_68;
  undefined8 local_60;
  size_t local_58;
  double local_50;
  rotation_t *local_48;
  translation_t *local_40;
  rotation_t *local_38;
  
  local_90 = position2;
  local_58 = numberPoints;
  local_50 = outlierFraction;
  local_40 = position1;
  local_38 = rotation1;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar26 = 0;
    uVar24 = 0;
    do {
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      generateRandomPoint((Vector3d *)local_e8,8.0,4.0);
      pdVar5 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar6 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      uVar20 = uVar6;
      if ((((ulong)(pdVar5 + uVar6 * uVar24) & 7) == 0) &&
         (uVar20 = (ulong)(-((uint)((ulong)(pdVar5 + uVar6 * uVar24) >> 3) & 0x1fffffff) & 7),
         (long)uVar6 <= (long)uVar20)) {
        uVar20 = uVar6;
      }
      uVar21 = uVar6 - uVar20;
      uVar19 = uVar21 + 7;
      if (-1 < (long)uVar21) {
        uVar19 = uVar21;
      }
      if (0 < (long)uVar20) {
        uVar22 = 0;
        do {
          *(undefined8 *)((long)pdVar5 + uVar22 * 8 + uVar6 * lVar26) =
               *(undefined8 *)(auStack_e0 + uVar22 * 8 + -8);
          uVar22 = uVar22 + 1;
        } while (uVar20 != uVar22);
      }
      uVar19 = (uVar19 & 0xfffffffffffffff8) + uVar20;
      if (7 < (long)uVar21) {
        do {
          lVar25 = uVar20 * 8;
          uVar14 = *(undefined8 *)(auStack_e0 + lVar25);
          uVar15 = *(undefined8 *)(auStack_e0 + lVar25 + 8);
          dVar4 = (&local_d0)[uVar20];
          prVar16 = (&local_c8)[uVar20];
          lVar17 = local_c0[uVar20].m_value;
          lVar18 = local_c0[uVar20 + 1].m_value;
          dVar10 = (&local_b0)[uVar20];
          puVar2 = (undefined8 *)((long)pdVar5 + uVar20 * 8 + uVar6 * lVar26);
          *puVar2 = *(undefined8 *)(auStack_e0 + lVar25 + -8);
          puVar2[1] = uVar14;
          puVar2[2] = uVar15;
          puVar2[3] = dVar4;
          puVar2[4] = prVar16;
          puVar2[5] = lVar17;
          puVar2[6] = lVar18;
          puVar2[7] = dVar10;
          uVar20 = uVar20 + 8;
        } while ((long)uVar20 < (long)uVar19);
      }
      if ((long)uVar19 < (long)uVar6) {
        do {
          *(undefined8 *)((long)pdVar5 + uVar19 * 8 + uVar6 * lVar26) =
               *(undefined8 *)(auStack_e0 + uVar19 * 8 + -8);
          uVar19 = uVar19 + 1;
        } while (uVar6 != uVar19);
      }
      uVar24 = uVar24 + 1;
      lVar26 = lVar26 + 8;
    } while (uVar24 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols);
  }
  auVar30 = in_ZMM2._0_16_;
  ptVar23 = local_90;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar26 = 0x10;
    uVar24 = 0;
    local_48 = rotation2;
    do {
      local_b0 = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                         m_storage.m_rows;
      auStack_e0._0_8_ =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           (long)local_b0 * uVar24;
      local_e8 = (undefined1  [8])local_38;
      local_c8 = (rotation_t *)gt;
      local_c0[0].m_value = 0;
      local_a8 = local_40;
      local_88 = (undefined1  [8])local_38;
      in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
      local_c0[1].m_value = uVar24;
      auStack_e0._8_8_ = local_b0;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&pdStack_80,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)auStack_e0);
      local_70 = (rotation_t *)local_88;
      local_68 = pdStack_80;
      local_60 = 3;
      local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[0] * *pdStack_80 +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[1] * pdStack_80[1] +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[2] * pdStack_80[2];
      local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[3] * *pdStack_80 +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[4] * pdStack_80[1] +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[5] * pdStack_80[2];
      local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[6] * *pdStack_80 +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[7] * pdStack_80[1] +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[8] * pdStack_80[2];
      free((void *)pdStack_80[-1]);
      iVar7._M_current =
           (points1->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (points1->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)points1,iVar7,&local_100);
      }
      else {
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[2] =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[2];
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[0] =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[0];
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[1] =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[1];
        ppMVar1 = &(points1->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      local_b0 = (double)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                         m_storage.m_rows;
      auStack_e0._8_8_ = local_b0;
      auStack_e0._0_8_ =
           (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           (long)local_b0 * uVar24;
      local_c8 = (rotation_t *)gt;
      local_c0[0].m_value = 0;
      local_e8 = (undefined1  [8])rotation2;
      local_c0[1].m_value = uVar24;
      local_a8 = ptVar23;
      local_88 = (undefined1  [8])rotation2;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)&pdStack_80,
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                  *)auStack_e0);
      local_70 = (rotation_t *)local_88;
      local_68 = pdStack_80;
      local_60 = 3;
      local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[0] * *pdStack_80 +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[1] * pdStack_80[1] +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[2] * pdStack_80[2];
      local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[3] * *pdStack_80 +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[4] * pdStack_80[1] +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[5] * pdStack_80[2];
      local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[6] * *pdStack_80 +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[7] * pdStack_80[1] +
            (((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_88)->m_storage).m_data
            .array[8] * pdStack_80[2];
      free((void *)pdStack_80[-1]);
      iVar7._M_current =
           (points2->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (points2->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)points2,iVar7,&local_100);
      }
      else {
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[2] =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[2];
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[0] =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[0];
        ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
        .m_data.array[1] =
             local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
             .array[1];
        ppMVar1 = &(points2->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      if (0.0 < noise) {
        pMVar8 = (points1->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        generateRandomTranslation((Vector3d *)local_e8,noise);
        rotation2 = local_48;
        pMVar9 = (points1->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar26 + -0x10);
        dVar4 = pdVar5[1];
        pdVar3 = (double *)
                 ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar26 + -0x10);
        *pdVar3 = *pdVar5 + (double)local_e8;
        pdVar3[1] = dVar4 + (double)auStack_e0._0_8_;
        *(double *)
         ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data + lVar26) =
             *(double *)
              ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data + lVar26) + (double)auStack_e0._8_8_;
        pMVar8 = (points2->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        generateRandomTranslation((Vector3d *)local_e8,noise);
        pMVar9 = (points2->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar5 = (double *)
                 ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar26 + -0x10);
        dVar4 = pdVar5[1];
        pdVar3 = (double *)
                 ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                         m_storage.m_data + lVar26 + -0x10);
        *pdVar3 = *pdVar5 + (double)local_e8;
        pdVar3[1] = dVar4 + (double)auStack_e0._0_8_;
        *(double *)
         ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data + lVar26) =
             *(double *)
              ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data + lVar26) + (double)auStack_e0._8_8_;
        ptVar23 = local_90;
      }
      auVar30 = in_ZMM2._0_16_;
      uVar24 = uVar24 + 1;
      lVar26 = lVar26 + 0x18;
    } while (uVar24 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_cols);
  }
  auVar30 = vcvtusi2sd_avx512f(auVar30,local_58);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar30._0_8_ * local_50;
  auVar30 = vroundsd_avx(auVar28,auVar28,9);
  lVar26 = vcvttsd2usi_avx512f(auVar30);
  if (lVar26 != 0) {
    lVar25 = 0x10;
    do {
      generateRandomPoint((Vector3d *)local_88,8.0,4.0);
      pMVar8 = (points2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar30._8_8_ = pdStack_80;
      auVar30._0_8_ = local_88;
      auStack_e0 = vsubpd_avx(auVar30,*(undefined1 (*) [16])
                                       (ptVar23->
                                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                       .m_storage.m_data.array);
      local_d0 = local_78 -
                 (ptVar23->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[2];
      local_c0[1].m_value = 3;
      dVar27 = auStack_e0._0_8_;
      dVar29 = auStack_e0._8_8_;
      dVar10 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[3];
      dVar11 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[4];
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
           m_data.array[2];
      auVar30 = vmovhpd_avx(auVar31,(rotation2->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                    m_storage.m_data.array[5]);
      dVar12 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[6];
      dVar13 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array[7];
      dVar4 = (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
              m_data.array[8];
      pdVar5 = (double *)
               ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar25 + -0x10);
      *pdVar5 = local_d0 * auVar30._0_8_ +
                dVar27 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[0] +
                dVar29 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                         m_storage.m_data.array[1];
      pdVar5[1] = local_d0 * auVar30._8_8_ + dVar27 * dVar10 + dVar29 * dVar11;
      *(double *)
       ((long)&(pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar25) = local_d0 * dVar4 + dVar27 * dVar12 + dVar29 * dVar13;
      lVar25 = lVar25 + 0x18;
      lVar26 = lVar26 + -1;
      local_e8 = (undefined1  [8])rotation2;
      local_c8 = rotation2;
      local_c0[0].m_value = (long)auStack_e0;
    } while (lVar26 != 0);
  }
  return;
}

Assistant:

void
opengv::generateRandom3D3DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & points1,
    bearingVectors_t & points2,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 3D-3D correspondences
  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //transform the points into the frames and store
    points1.push_back(rotation1.transpose()*(gt.col(i) - position1));
    points2.push_back(rotation2.transpose()*(gt.col(i) - position2));

    //add noise
    if( noise > 0.0 )
    {
      points1[i] = points1[i] + generateRandomTranslation(noise);
      points2[i] = points2[i] + generateRandomTranslation(noise);
    }
  }

  //add outliers
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //generate a random point
    point_t p = generateRandomPoint(8,4);

    //push-back in frame 2 only to create outlier
    points2[i] = rotation2.transpose()*(p - position2);
  }
}